

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluation_method.cpp
# Opt level: O3

void MPIX_Internode_cost_stencil
               (MPI_Comm cart_comm,int *total,int *max,int *stencil,int n_neighbors)

{
  int *piVar1;
  int num_neighbors;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  int *periods;
  long alStack_80 [2];
  code *pcStack_70;
  int aiStack_68 [2];
  MPI_Comm local_60;
  MPI_Comm dist_graph;
  int status;
  int ndims;
  int *local_48;
  int *local_40;
  int local_34;
  
  pcStack_70 = (code *)0x134ccb;
  _status = max;
  local_48 = total;
  local_40 = stencil;
  local_34 = n_neighbors;
  MPI_Topo_test(cart_comm,&dist_graph);
  if ((int)dist_graph == 1) {
    pcStack_70 = (code *)0x134ce3;
    MPI_Cartdim_get(cart_comm,(long)&dist_graph + 4);
    piVar4 = (int *)((long)aiStack_68 - ((ulong)dist_graph._4_4_ * 4 + 0xf & 0xfffffffffffffff0));
    uVar3 = (ulong)dist_graph._4_4_;
    uVar2 = uVar3 * 4 + 0xf & 0xfffffffffffffff0;
    periods = (int *)((long)piVar4 - uVar2);
    *(undefined8 *)((long)periods + (-8 - uVar2)) = 0x134d2b;
    MPI_Cart_get(cart_comm,uVar3,piVar4,periods);
    num_neighbors = local_34;
    piVar1 = local_40;
    *(MPI_Comm **)((long)periods + (-0x10 - uVar2)) = &local_60;
    *(undefined8 *)((long)periods + (-0x18 - uVar2)) = 0x134d4b;
    mpireorderinglib::MPIX_Dist_graph_create_from_cart_comm
              (cart_comm,dist_graph._4_4_,piVar1,num_neighbors,piVar4,periods,
               *(MPI_Comm **)((long)periods + (-0x10 - uVar2)));
    piVar4 = local_48;
    piVar1 = _status;
    *(undefined8 *)((long)periods + (-8 - uVar2)) = 0x134d5f;
    mpireorderinglib::MPIX_Dist_graph_internode_cost(local_60,piVar4,piVar1);
    *(undefined8 *)((long)periods + (-8 - uVar2)) = 0x134d67;
    MPI_Comm_free(&local_60);
    return;
  }
  pcStack_70 = MPIX_Internode_cost;
  __assert_fail("status == MPI_CART",
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/Evaluation/evaluation_method.cpp"
                ,0xd9,"void MPIX_Internode_cost_stencil(MPI_Comm, int *, int *, int *, int)");
}

Assistant:

void MPIX_Internode_cost_stencil(MPI_Comm cart_comm, int *total, int *max, int stencil[], int n_neighbors) {
  int status;
  MPI_Topo_test(cart_comm, &status);
  assert(status == MPI_CART);
  MPI_Comm dist_graph;
  int ndims;
  MPI_Cartdim_get(cart_comm, &ndims);
  int dims[ndims], periods[ndims], coords[ndims];
  MPI_Cart_get(cart_comm, ndims, dims, periods, coords);
  mpireorderinglib::MPIX_Dist_graph_create_from_cart_comm(cart_comm,
														  ndims,
														  stencil,
														  n_neighbors,
														  dims,
														  periods,
														  &dist_graph);
  mpireorderinglib::MPIX_Dist_graph_internode_cost(dist_graph, total, max);
  MPI_Comm_free(&dist_graph);
}